

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O2

QRect __thiscall QFbCursor::getCurrentRect(QFbCursor *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect QVar6;
  QRect local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (QRect)QImage::rect();
  QVar5 = QRect::translated(&local_40,-(int)*(undefined8 *)(*(long *)(this + 0x48) + 0x18),
                            -(int)((ulong)*(undefined8 *)(*(long *)(this + 0x48) + 0x18) >> 0x20));
  iVar1 = *(int *)(this + 0x58);
  iVar2 = *(int *)(this + 0x5c);
  uVar3 = (**(code **)(**(long **)(this + 0x18) + 0x68))();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    iVar4 = (int)((ulong)uVar3 >> 0x20);
    QVar6.x2.m_i = (QVar5.x2.m_i.m_i + iVar1) - (int)uVar3;
    QVar6.y1.m_i = (QVar5.y1.m_i.m_i + iVar2) - iVar4;
    QVar6.x1.m_i = (iVar1 + QVar5.x1.m_i.m_i) - (int)uVar3;
    QVar6.y2.m_i = (QVar5.y2.m_i.m_i + iVar2) - iVar4;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFbCursor::getCurrentRect() const
{
    QRect rect = mCursorImage->image()->rect().translated(-mCursorImage->hotspot().x(),
                                                          -mCursorImage->hotspot().y());
    rect.translate(m_pos);
    QPoint mScreenOffset = mScreen->geometry().topLeft();
    rect.translate(-mScreenOffset);  // global to local translation
    return rect;
}